

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  cmdline_key_action *pcVar8;
  char *pcVar9;
  size_t n;
  bool bVar10;
  keyact local_4c;
  char *local_48;
  char *local_40;
  FILE *local_38;
  
  progname = *argv;
  if (1 < argc) {
    bVar2 = 1;
    local_38 = (FILE *)0x0;
    local_48 = (char *)0x0;
    local_40 = (char *)0x0;
    local_4c = KEYACT_AGENT_LOAD;
LAB_0010bce9:
    iVar7 = argc + -1;
    pcVar9 = argv[1];
    ppcVar1 = argv + 1;
    if (!(bool)(*pcVar9 == '-' & bVar2)) {
      pcVar8 = (cmdline_key_action *)safemalloc(1,0x18,0);
      pcVar8->action = local_4c;
      pcVar8->filename = pcVar9;
      pcVar8->next = (cmdline_key_action *)0x0;
      if (keyact_tail == (cmdline_key_action *)0x0) {
        keyact_tail = (cmdline_key_action *)&keyact_head;
      }
      keyact_tail->next = pcVar8;
      argv = ppcVar1;
      argc = iVar7;
      keyact_tail = pcVar8;
      goto LAB_0010c077;
    }
    if (((pcVar9[1] == 'V') && (pcVar9[2] == '\0')) ||
       (iVar6 = strcmp(pcVar9,"--version"), iVar6 == 0)) {
      pcVar9 = buildinfo("\n");
      printf("pageant: %s\n%s\n","Unidentified build",pcVar9);
      safefree(pcVar9);
      exit(0);
    }
    iVar6 = strcmp(pcVar9,"--help");
    if (iVar6 == 0) {
      usage();
      goto LAB_0010c44a;
    }
    if ((pcVar9[1] == 'v') && (pcVar9[2] == '\0')) {
      local_38 = _stderr;
LAB_0010c074:
      bVar2 = 1;
      argv = ppcVar1;
      argc = iVar7;
    }
    else {
      if ((pcVar9[1] == 'a') && (pcVar9[2] == '\0')) {
        local_4c = KEYACT_CLIENT_ADD;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 'd') && (pcVar9[2] == '\0')) {
        local_4c = KEYACT_CLIENT_DEL;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 'r') && (pcVar9[2] == '\0')) {
        local_4c = KEYACT_CLIENT_REENCRYPT;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 's') && (pcVar9[2] == '\0')) {
        shell_type = ADDRTYPE_IPV4;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 'c') && (pcVar9[2] == '\0')) {
        shell_type = ADDRTYPE_IPV6;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 'D') && (pcVar9[2] == '\0')) {
        pcVar8 = (cmdline_key_action *)safemalloc(1,0x18,0);
        pcVar8->action = KEYACT_CLIENT_DEL_ALL;
LAB_0010c04c:
        pcVar8->filename = (char *)0x0;
        pcVar8->next = (cmdline_key_action *)0x0;
        if (keyact_tail == (cmdline_key_action *)0x0) {
          keyact_tail = (cmdline_key_action *)&keyact_head;
        }
        keyact_tail->next = pcVar8;
        keyact_tail = pcVar8;
        goto LAB_0010c074;
      }
      if ((pcVar9[1] == 'R') && (pcVar9[2] == '\0')) {
        pcVar8 = (cmdline_key_action *)safemalloc(1,0x18,0);
        pcVar8->action = KEYACT_CLIENT_REENCRYPT_ALL;
        goto LAB_0010c04c;
      }
      if ((pcVar9[1] == 'l') && (pcVar9[2] == '\0')) {
        pcVar8 = (cmdline_key_action *)safemalloc(1,0x18,0);
        pcVar8->action = KEYACT_CLIENT_LIST;
        goto LAB_0010c04c;
      }
      iVar6 = strcmp(pcVar9,"--public");
      bVar2 = 1;
      if (iVar6 == 0) {
        local_4c = KEYACT_CLIENT_PUBLIC;
        argv = ppcVar1;
        argc = iVar7;
      }
      else {
        iVar6 = strcmp(pcVar9,"--public-openssh");
        if ((iVar6 == 0) || ((pcVar9[1] == 'L' && (pcVar9[2] == '\0')))) {
          local_4c = KEYACT_CLIENT_PUBLIC_OPENSSH;
          argv = ppcVar1;
          argc = iVar7;
        }
        else if ((pcVar9[1] == 'X') && (pcVar9[2] == '\0')) {
          life = ADDRTYPE_IPV4;
          argv = ppcVar1;
          argc = iVar7;
        }
        else if ((pcVar9[1] == 'T') && (pcVar9[2] == '\0')) {
          life = ADDRTYPE_IPV6;
          argv = ppcVar1;
          argc = iVar7;
        }
        else {
          iVar6 = strcmp(pcVar9,"--no-decrypt");
          if (((((iVar6 == 0) || (iVar6 = strcmp(pcVar9,"-no-decrypt"), iVar6 == 0)) ||
               (iVar6 = strcmp(pcVar9,"--no_decrypt"), iVar6 == 0)) ||
              (((iVar6 = strcmp(pcVar9,"-no_decrypt"), iVar6 == 0 ||
                (iVar6 = strcmp(pcVar9,"--nodecrypt"), iVar6 == 0)) ||
               (iVar6 = strcmp(pcVar9,"-nodecrypt"), iVar6 == 0)))) ||
             ((iVar6 = strcmp(pcVar9,"--encrypted"), iVar6 == 0 ||
              (iVar6 = strcmp(pcVar9,"-encrypted"), iVar6 == 0)))) {
            if (local_4c == KEYACT_AGENT_LOAD) {
              local_4c = KEYACT_AGENT_LOAD_ENCRYPTED;
              argv = ppcVar1;
              argc = iVar7;
            }
            else {
              if (local_4c != KEYACT_CLIENT_ADD) goto LAB_0010c454;
              local_4c = KEYACT_CLIENT_ADD_ENCRYPTED;
              argv = ppcVar1;
              argc = iVar7;
            }
          }
          else {
            iVar6 = strcmp(pcVar9,"--debug");
            if (iVar6 == 0) {
              life = ADDRTYPE_LOCAL;
              argv = ppcVar1;
              argc = iVar7;
            }
            else {
              iVar6 = strcmp(pcVar9,"--test-sign");
              if (iVar6 == 0) {
                sign_flags = 0;
              }
              else {
                _Var5 = strstartswith(pcVar9,"--test-sign-with-flags=");
                if (!_Var5) {
                  iVar6 = strcmp(pcVar9,"--permanent");
                  if (iVar6 == 0) {
                    life = ADDRTYPE_NAME;
                    argv = ppcVar1;
                    argc = iVar7;
                  }
                  else {
                    iVar6 = strcmp(pcVar9,"--exec");
                    if (iVar6 == 0) {
                      life = CS_ISO8859_4;
                      if (argc == 2) goto LAB_0010c480;
                      exec_args = argv + 2;
                      goto LAB_0010c2aa;
                    }
                    iVar6 = strcmp(pcVar9,"--tty-prompt");
                    if (iVar6 == 0) {
                      prompt_type = ADDRTYPE_IPV4;
                      argv = ppcVar1;
                      argc = iVar7;
                    }
                    else {
                      iVar6 = strcmp(pcVar9,"--gui-prompt");
                      if (iVar6 == 0) {
                        prompt_type = ADDRTYPE_IPV6;
                        argv = ppcVar1;
                        argc = iVar7;
                        goto LAB_0010c077;
                      }
                      iVar6 = strcmp(pcVar9,"--askpass");
                      if (iVar6 == 0) {
                        if (argc == 2) goto LAB_0010c45e;
                        local_40 = argv[2];
                      }
                      else {
                        iVar6 = strcmp(pcVar9,"--symlink");
                        if (iVar6 == 0) {
                          if (argc == 2) goto LAB_0010c463;
                          local_48 = argv[2];
                        }
                        else {
                          if (*pcVar9 == '-') {
                            if (((pcVar9[1] != 'E') || (pcVar9[2] != '\0')) &&
                               (iVar6 = strcmp(pcVar9,"--fptype"), iVar6 != 0)) {
                              if ((pcVar9[1] == '-') && (pcVar9[2] == '\0')) {
                                bVar2 = 0;
                                argv = ppcVar1;
                                argc = iVar7;
                                goto LAB_0010c077;
                              }
                              goto LAB_0010c468;
                            }
                          }
                          else {
                            iVar7 = strcmp(pcVar9,"--fptype");
                            if (iVar7 != 0) goto LAB_0010c468;
                          }
                          if (argc == 2) goto LAB_0010c470;
                          pcVar9 = argv[2];
                          iVar7 = strcmp(pcVar9,"md5");
                          if ((iVar7 != 0) && (iVar6 = strcmp(pcVar9,"sha256"), iVar6 != 0))
                          goto LAB_0010c478;
                          key_list_fptype = iVar7 == 0;
                        }
                      }
                      argv = argv + 2;
                      argc = argc + -2;
                    }
                  }
                  goto LAB_0010c077;
                }
                sign_flags = atoi(pcVar9 + 0x17);
              }
              local_4c = KEYACT_CLIENT_SIGN;
              argv = ppcVar1;
              argc = iVar7;
            }
          }
        }
      }
    }
LAB_0010c077:
    if (argc < 2) goto LAB_0010c2aa;
    goto LAB_0010bce9;
  }
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = (FILE *)0x0;
LAB_0010c2aa:
  if ((life == CS_ISO8859_4) && (exec_args == (char **)0x0)) {
LAB_0010c44a:
    main_cold_8();
  }
  else {
    if (((display == (char *)0x0) && (display = getenv("DISPLAY"), display != (char *)0x0)) &&
       (*display == '\0')) {
      display = (char *)0x0;
    }
    if (local_40 != (char *)0x0) {
      pcVar9 = askpass(local_40);
      if (pcVar9 != (char *)0x0) {
        puts(pcVar9);
        fflush(_stdout);
        n = strlen(pcVar9);
        smemclr(pcVar9,n);
        safefree(pcVar9);
        return 0;
      }
      return 1;
    }
    putty_signal(0xd,(_func_void_int *)0x1);
    sk_init();
    uxsel_init();
    if (keyact_head == (cmdline_key_action *)0x0) {
      if (life != ADDRTYPE_UNSPEC) goto LAB_0010c3b7;
    }
    else {
      bVar4 = false;
      pcVar8 = keyact_head;
      bVar2 = 0;
      do {
        bVar3 = bVar2;
        bVar10 = pcVar8->action < KEYACT_CLIENT_ADD;
        if (!bVar10) {
          bVar4 = true;
        }
        pcVar8 = pcVar8->next;
        bVar2 = bVar3 | bVar10;
      } while (pcVar8 != (cmdline_key_action *)0x0);
      if (life != ADDRTYPE_UNSPEC) {
        if (bVar4) {
          main_cold_9();
          return 1;
        }
LAB_0010c3b7:
        run_agent(local_38,local_48);
        return 0;
      }
      if ((bool)(bVar3 | bVar10)) goto LAB_0010c459;
      if (bVar4) {
        run_client();
        return 0;
      }
    }
  }
  main_cold_11();
LAB_0010c454:
  main_cold_7();
LAB_0010c459:
  main_cold_10();
LAB_0010c45e:
  main_cold_5();
LAB_0010c463:
  main_cold_4();
LAB_0010c468:
  main_cold_1();
LAB_0010c470:
  main_cold_3();
LAB_0010c478:
  main_cold_2();
LAB_0010c480:
  main_cold_6();
  puts("Pageant: SSH agent");
  puts("Unidentified build");
  puts("Usage: pageant <lifetime> [[--encrypted] key files]");
  puts("       pageant [[--encrypted] key files] --exec <command> [args]");
  puts("       pageant -a [--encrypted] [key files]");
  puts("       pageant -d [key identifiers]");
  puts("       pageant -D");
  puts("       pageant -r [key identifiers]");
  puts("       pageant -R");
  puts("       pageant --public [key identifiers]");
  puts("       pageant ( --public-openssh | -L ) [key identifiers]");
  puts("       pageant -l [-E fptype]");
  puts("Lifetime options, for running Pageant as an agent:");
  puts("  -X           run with the lifetime of the X server");
  puts("  -T           run with the lifetime of the controlling tty");
  puts("  --permanent  run permanently");
  puts("  --debug      run in debugging mode, without forking");
  puts("  --exec <command>   run with the lifetime of that command");
  puts("Client options, for talking to an existing agent:");
  puts("  -a           add key(s) to the existing agent");
  puts("  -l           list currently loaded key fingerprints and comments");
  puts("  --public     print public keys in RFC 4716 format");
  puts("  --public-openssh, -L   print public keys in OpenSSH format");
  puts("  -d           delete key(s) from the agent");
  puts("  -D           delete all keys from the agent");
  puts("  -r           re-encrypt keys in the agent (forget cleartext)");
  puts("  -R           re-encrypt all possible keys in the agent");
  puts("Other options:");
  puts("  -v           verbose mode (in agent mode)");
  puts("  -s -c        force POSIX or C shell syntax (in agent mode)");
  puts("  --symlink path   create symlink to socket (in agent mode)");
  puts("  --encrypted  when adding keys, don\'t decrypt");
  puts("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)");
  puts("  --tty-prompt force tty-based passphrase prompt");
  puts("  --gui-prompt force GUI-based passphrase prompt");
  puts("  --askpass <prompt>   behave like a standalone askpass program");
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    keyact curr_keyact = KEYACT_AGENT_LOAD;
    const char *standalone_askpass_prompt = NULL;
    const char *symlink_path = NULL;
    FILE *logfp = NULL;

    progname = argv[0];

    /*
     * Process the command line.
     */
    while (--argc > 0) {
        char *p = *++argv;
        if (*p == '-' && doing_opts) {
            if (!strcmp(p, "-V") || !strcmp(p, "--version")) {
                version();
            } else if (!strcmp(p, "--help")) {
                usage();
                exit(0);
            } else if (!strcmp(p, "-v")) {
                logfp = stderr;
            } else if (!strcmp(p, "-a")) {
                curr_keyact = KEYACT_CLIENT_ADD;
            } else if (!strcmp(p, "-d")) {
                curr_keyact = KEYACT_CLIENT_DEL;
            } else if (!strcmp(p, "-r")) {
                curr_keyact = KEYACT_CLIENT_REENCRYPT;
            } else if (!strcmp(p, "-s")) {
                shell_type = SHELL_SH;
            } else if (!strcmp(p, "-c")) {
                shell_type = SHELL_CSH;
            } else if (!strcmp(p, "-D")) {
                add_keyact(KEYACT_CLIENT_DEL_ALL, NULL);
            } else if (!strcmp(p, "-R")) {
                add_keyact(KEYACT_CLIENT_REENCRYPT_ALL, NULL);
            } else if (!strcmp(p, "-l")) {
                add_keyact(KEYACT_CLIENT_LIST, NULL);
            } else if (!strcmp(p, "--public")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC;
            } else if (!strcmp(p, "--public-openssh") || !strcmp(p, "-L")) {
                curr_keyact = KEYACT_CLIENT_PUBLIC_OPENSSH;
            } else if (!strcmp(p, "-X")) {
                life = LIFE_X11;
            } else if (!strcmp(p, "-T")) {
                life = LIFE_TTY;
            } else if (!strcmp(p, "--no-decrypt") ||
                       !strcmp(p, "-no-decrypt") ||
                       !strcmp(p, "--no_decrypt") ||
                       !strcmp(p, "-no_decrypt") ||
                       !strcmp(p, "--nodecrypt") ||
                       !strcmp(p, "-nodecrypt") ||
                       !strcmp(p, "--encrypted") ||
                       !strcmp(p, "-encrypted")) {
                if (curr_keyact == KEYACT_AGENT_LOAD)
                    curr_keyact = KEYACT_AGENT_LOAD_ENCRYPTED;
                else if (curr_keyact == KEYACT_CLIENT_ADD)
                    curr_keyact = KEYACT_CLIENT_ADD_ENCRYPTED;
                else {
                    fprintf(stderr, "pageant: unexpected -E while not adding "
                            "keys\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--debug")) {
                life = LIFE_DEBUG;
            } else if (!strcmp(p, "--test-sign")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = 0;
            } else if (strstartswith(p, "--test-sign-with-flags=")) {
                curr_keyact = KEYACT_CLIENT_SIGN;
                sign_flags = atoi(p + strlen("--test-sign-with-flags="));
            } else if (!strcmp(p, "--permanent")) {
                life = LIFE_PERM;
            } else if (!strcmp(p, "--exec")) {
                life = LIFE_EXEC;
                /* Now all subsequent arguments go to the exec command. */
                if (--argc > 0) {
                    exec_args = ++argv;
                    argc = 0;          /* force end of option processing */
                } else {
                    fprintf(stderr, "pageant: expected a command "
                            "after --exec\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--tty-prompt")) {
                prompt_type = PROMPT_TTY;
            } else if (!strcmp(p, "--gui-prompt")) {
                prompt_type = PROMPT_GUI;
            } else if (!strcmp(p, "--askpass")) {
                if (--argc > 0) {
                    standalone_askpass_prompt = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a prompt message "
                            "after --askpass\n");
                    exit(1);
                }
            } else if (!strcmp(p, "--symlink")) {
                if (--argc > 0) {
                    symlink_path = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a pathname "
                            "after --symlink\n");
                    exit(1);
                }
            } else if (!strcmp(p, "-E") || !strcmp(p, "--fptype")) {
                const char *keyword;
                if (--argc > 0) {
                    keyword = *++argv;
                } else {
                    fprintf(stderr, "pageant: expected a type string "
                            "after %s\n", p);
                    exit(1);
                }
                if (!strcmp(keyword, "md5"))
                    key_list_fptype = SSH_FPTYPE_MD5;
                else if (!strcmp(keyword, "sha256"))
                    key_list_fptype = SSH_FPTYPE_SHA256;
                else {
                    fprintf(stderr, "pageant: unknown fingerprint type `%s'\n",
                            keyword);
                    exit(1);
                }
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else {
                fprintf(stderr, "pageant: unrecognised option '%s'\n", p);
                exit(1);
            }
        } else {
            /*
             * Non-option arguments (apart from those after --exec,
             * which are treated specially above) are interpreted as
             * the names of private key files to either add or delete
             * from an agent.
             */
            add_keyact(curr_keyact, p);
        }
    }

    if (life == LIFE_EXEC && !exec_args) {
        fprintf(stderr, "pageant: expected a command with --exec\n");
        exit(1);
    }

    if (!display) {
        display = getenv("DISPLAY");
        if (display && !*display)
            display = NULL;
    }

    /*
     * Deal with standalone-askpass mode.
     */
    if (standalone_askpass_prompt) {
        char *passphrase = askpass(standalone_askpass_prompt);

        if (!passphrase)
            return 1;

        puts(passphrase);
        fflush(stdout);

        smemclr(passphrase, strlen(passphrase));
        sfree(passphrase);
        return 0;
    }

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    /*
     * Now distinguish our two main running modes. Either we're
     * actually starting up an agent, in which case we should have a
     * lifetime mode, and no key actions of KEYACT_CLIENT_* type; or
     * else we're contacting an existing agent to add or remove keys,
     * in which case we should have no lifetime mode, and no key
     * actions of KEYACT_AGENT_* type.
     */
    {
        bool has_agent_actions = false;
        bool has_client_actions = false;
        bool has_lifetime = false;
        const struct cmdline_key_action *act;

        for (act = keyact_head; act; act = act->next) {
            if (is_agent_action(act->action))
                has_agent_actions = true;
            else
                has_client_actions = true;
        }
        if (life != LIFE_UNSPEC)
            has_lifetime = true;

        if (has_lifetime && has_client_actions) {
            fprintf(stderr, "pageant: client key actions (-a, -d, -D, -r, -R, "
                    "-l, -L) do not go with an agent lifetime option\n");
            exit(1);
        }
        if (!has_lifetime && has_agent_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option with"
                    " bare key file arguments\n");
            exit(1);
        }
        if (!has_lifetime && !has_client_actions) {
            fprintf(stderr, "pageant: expected an agent lifetime option"
                    " or a client key action\n");
            exit(1);
        }

        if (has_lifetime) {
            run_agent(logfp, symlink_path);
        } else if (has_client_actions) {
            run_client();
        }
    }

    return 0;
}